

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O2

void __thiscall
cs::compiler_type::build_expr
          (compiler_type *this,deque<char,_std::allocator<char>_> *buff,
          tree_type<cs::token_base_*> *tree,charset encoding)

{
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_Deque_base
            (&tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  process_char_buff(this,buff,&tokens,encoding);
  process_brackets(this,&tokens);
  kill_brackets(this,&tokens,1);
  gen_tree(this,tree,&tokens);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            (&tokens.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>);
  return;
}

Assistant:

void build_expr(const std::deque<char> &buff, tree_type<token_base *> &tree, charset encoding = charset::utf8)
		{
			std::deque<token_base *> tokens;
			process_char_buff(buff, tokens, encoding);
			process_brackets(tokens);
			kill_brackets(tokens);
			gen_tree(tree, tokens);
		}